

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uttt.h
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
uttt::IBoardWriter::operator()
          (IBoardWriter *this,vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *boards)

{
  bool bVar1;
  size_type sVar2;
  reference pIVar3;
  reference pvVar4;
  const_reference pvVar5;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RDI;
  value_type *it;
  IBoard *board;
  const_iterator __end2;
  const_iterator __begin2;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *__range2;
  longlong offset;
  vector<char,_std::allocator<char>_> *bytes;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_stack_ffffffffffffff78;
  vector<char,_std::allocator<char>_> *this_00;
  allocator_type *__a;
  allocator<char> *__n;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
  local_48;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *local_40;
  size_type local_38;
  allocator<char> local_1a;
  undefined1 local_19;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  sVar2 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::size(in_RDX);
  __a = (allocator_type *)(sVar2 * 0x18);
  __n = &local_1a;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(in_stack_ffffffffffffffa0,(size_type)__n,__a);
  std::allocator<char>::~allocator(&local_1a);
  local_38 = 0;
  local_40 = local_18;
  local_48._M_current =
       (IBoard *)
       std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::begin(in_stack_ffffffffffffff78);
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::end(in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                             *)this_00,
                            (__normal_iterator<const_uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
             ::operator*(&local_48);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](in_RDI,local_38);
    *pvVar4 = (value_type)((uint)pIVar3->macro >> 0x18);
    pvVar4[1] = (value_type)((uint)pIVar3->macro >> 0x10);
    pvVar4[2] = (value_type)((uint)pIVar3->macro >> 8);
    pvVar4[3] = (value_type)pIVar3->macro;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[4] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[5] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[6] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[7] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[8] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[9] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[10] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0xb] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0xc] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0xd] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0xe] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0xf] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0x10] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0x11] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0x12] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0x13] = (value_type)*pvVar5;
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0x14] = (value_type)((ushort)*pvVar5 >> 8);
    pvVar5 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)this_00,(size_type)in_stack_ffffffffffffff78);
    pvVar4[0x15] = (value_type)*pvVar5;
    pvVar4[0x16] = pIVar3->next;
    pvVar4[0x17] = pIVar3->player;
    local_38 = local_38 + 0x18;
    __gnu_cxx::
    __normal_iterator<const_uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
    ::operator++(&local_48);
  }
  return this_00;
}

Assistant:

std::vector<char> operator()(const std::vector<IBoard> &boards) const
    {
        std::vector<char> bytes(IBoardSize * boards.size());
        long long offset = 0;
        for (const auto &board : boards)
        {
            auto it = &bytes[offset];
            it[0] = uint32_t(board.macro) >> 24;
            it[1] = (uint32_t(board.macro) >> 16) & 0xff;
            it[2] = (uint32_t(board.macro) >> 8) & 0xff;
            it[3] = uint32_t(board.macro) & 0xff;
            it[4] = uint16_t(board.micro[0]) >> 8;
            it[5] = board.micro[0] & 0xff;
            it[6] = uint16_t(board.micro[1]) >> 8;
            it[7] = board.micro[1] & 0xff;
            it[8] = uint16_t(board.micro[2]) >> 8;
            it[9] = board.micro[2] & 0xff;
            it[10] = uint16_t(board.micro[3]) >> 8;
            it[11] = board.micro[3] & 0xff;
            it[12] = uint16_t(board.micro[4]) >> 8;
            it[13] = board.micro[4] & 0xff;
            it[14] = uint16_t(board.micro[5]) >> 8;
            it[15] = board.micro[5] & 0xff;
            it[16] = uint16_t(board.micro[6]) >> 8;
            it[17] = board.micro[6] & 0xff;
            it[18] = uint16_t(board.micro[7]) >> 8;
            it[19] = board.micro[7] & 0xff;
            it[20] = uint16_t(board.micro[8]) >> 8;
            it[21] = board.micro[8] & 0xff;
            it[22] = board.next;
            it[23] = board.player;
            offset += IBoardSize;
        }
        return bytes;
    }